

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O3

int __thiscall Fl_Tabs::handle(Fl_Tabs *this,int event)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Fl_Widget *in_RAX;
  Fl_Widget *pFVar6;
  Fl_Widget **ppFVar7;
  Fl_Tabs *pFVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  Fl_Widget_Tracker wp;
  Fl_Widget_Tracker local_28;
  
  local_28.wp_ = in_RAX;
  switch(event) {
  case 1:
    iVar5 = tab_height(this);
    iVar4 = (this->super_Fl_Group).super_Fl_Widget.y_ + iVar5;
    if (iVar5 < 0) {
      if (iVar4 + (this->super_Fl_Group).super_Fl_Widget.h_ <= Fl::e_y)
      goto switchD_001cdabe_caseD_2;
    }
    else if (Fl::e_y <= iVar4) goto switchD_001cdabe_caseD_2;
    event = 1;
    goto LAB_001cdcb5;
  case 2:
  case 5:
switchD_001cdabe_caseD_2:
    pFVar6 = which(this,Fl::e_x,Fl::e_y);
    if (event == 2) {
      if (this->push_ != (Fl_Widget *)0x0) {
        if ((this->push_->flags_ & 2) != 0) {
          redraw_tabs(this);
        }
        this->push_ = (Fl_Widget *)0x0;
      }
      if (pFVar6 != (Fl_Widget *)0x0) {
        bVar3 = Fl::option(OPTION_VISIBLE_FOCUS);
        if ((bVar3) && ((Fl_Tabs *)Fl::focus_ != this)) {
          Fl::focus((Fl_Widget *)this);
          redraw_tabs(this);
        }
        iVar5 = value(this,pFVar6);
        if ((iVar5 != 0) || (((this->super_Fl_Group).super_Fl_Widget.when_ & 2) != 0)) {
          Fl_Widget_Tracker::Fl_Widget_Tracker(&local_28,pFVar6);
          puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
          *(byte *)puVar1 = (byte)*puVar1 | 0x80;
          Fl_Widget::do_callback
                    ((Fl_Widget *)this,(Fl_Widget *)this,
                     (this->super_Fl_Group).super_Fl_Widget.user_data_);
          Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_28);
          if (local_28.wp_ == (Fl_Widget *)0x0) {
            return 1;
          }
        }
      }
      Fl_Tooltip::current(pFVar6);
    }
    else {
      push(this,pFVar6);
    }
    return 1;
  case 6:
  case 7:
    bVar3 = Fl::option(OPTION_VISIBLE_FOCUS);
    if ((((bVar3) && ((uint)Fl::e_number < 0xd)) && ((0x11c4U >> (Fl::e_number & 0x1fU) & 1) != 0))
       && (redraw_tabs(this), Fl::e_number != 6)) {
      return (uint)(Fl::e_number != 7);
    }
    break;
  case 8:
    if (Fl::e_keysym != 0xff54) {
      if (Fl::e_keysym == 0xff53) {
        lVar11 = (long)(this->super_Fl_Group).children_;
        if (lVar11 == 0) {
          return 0;
        }
        ppFVar7 = Fl_Group::array(&this->super_Fl_Group);
        if ((ppFVar7[lVar11 + -1]->flags_ & 2) == 0) {
          return 0;
        }
        if ((this->super_Fl_Group).children_ < 1) {
          uVar10 = 0;
        }
        else {
          uVar10 = 0;
          do {
            ppFVar7 = Fl_Group::array(&this->super_Fl_Group);
            if ((ppFVar7[uVar10]->flags_ & 2) == 0) break;
            uVar10 = uVar10 + 1;
          } while ((long)uVar10 < (long)(this->super_Fl_Group).children_);
          uVar10 = uVar10 & 0xffffffff;
        }
        ppFVar7 = Fl_Group::array(&this->super_Fl_Group);
        pFVar6 = ppFVar7[uVar10 + 1];
      }
      else {
        if (Fl::e_keysym != 0xff51) {
          event = 8;
          goto LAB_001cdcb5;
        }
        if ((this->super_Fl_Group).children_ == 0) {
          return 0;
        }
        ppFVar7 = Fl_Group::array(&this->super_Fl_Group);
        if (((*ppFVar7)->flags_ & 2) == 0) {
          return 0;
        }
        uVar10 = 1;
        if (1 < (this->super_Fl_Group).children_) {
          do {
            ppFVar7 = Fl_Group::array(&this->super_Fl_Group);
            if ((ppFVar7[uVar10]->flags_ & 2) == 0) break;
            uVar10 = uVar10 + 1;
          } while ((long)uVar10 < (long)(this->super_Fl_Group).children_);
          uVar10 = uVar10 & 0xffffffff;
        }
        ppFVar7 = Fl_Group::array(&this->super_Fl_Group);
        pFVar6 = ppFVar7[uVar10 - 1];
      }
      value(this,pFVar6);
LAB_001cde5f:
      puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
LAB_001cde63:
      Fl_Widget::do_callback
                ((Fl_Widget *)this,(Fl_Widget *)this,
                 (this->super_Fl_Group).super_Fl_Widget.user_data_);
      return 1;
    }
    Fl_Widget::redraw((Fl_Widget *)this);
    event = 6;
    goto LAB_001cdcb5;
  case 0xb:
    iVar5 = Fl_Group::handle(&this->super_Fl_Group,0xb);
    pFVar6 = Fl_Tooltip::widget_;
    iVar4 = tab_height(this);
    iVar9 = (this->super_Fl_Group).super_Fl_Widget.y_ + iVar4;
    if (iVar4 < 0) {
      if (Fl::e_y < iVar9 + (this->super_Fl_Group).super_Fl_Widget.h_) {
        return iVar5;
      }
    }
    else if (iVar9 < Fl::e_y) {
      return iVar5;
    }
    pFVar8 = (Fl_Tabs *)which(this,Fl::e_x,Fl::e_y);
    if (pFVar8 == (Fl_Tabs *)0x0) {
      pFVar8 = this;
    }
    if (pFVar8 != (Fl_Tabs *)pFVar6) {
      (*Fl_Tooltip::enter)((Fl_Widget *)pFVar8);
      return iVar5;
    }
    return iVar5;
  case 0xc:
    if (0 < (this->super_Fl_Group).children_) {
      lVar11 = 0;
      do {
        ppFVar7 = Fl_Group::array(&this->super_Fl_Group);
        pFVar6 = ppFVar7[lVar11];
        iVar5 = Fl_Widget::test_shortcut((pFVar6->label_).value,false);
        if (iVar5 != 0) {
          uVar2 = pFVar6->flags_;
          value(this,pFVar6);
          if ((uVar2 & 2) != 0) goto LAB_001cde5f;
          goto LAB_001cde63;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < (this->super_Fl_Group).children_);
    }
    event = 0xc;
    goto LAB_001cdcb5;
  case 0x10:
    value(this);
  }
LAB_001cdcb5:
  iVar5 = Fl_Group::handle(&this->super_Fl_Group,event);
  return iVar5;
}

Assistant:

int Fl_Tabs::handle(int event) {

  Fl_Widget *o;
  int i;

  switch (event) {

  case FL_PUSH: {
    int H = tab_height();
    if (H >= 0) {
      if (Fl::event_y() > y()+H) return Fl_Group::handle(event);
    } else {
      if (Fl::event_y() < y()+h()+H) return Fl_Group::handle(event);
    }}
    /* FALLTHROUGH */
  case FL_DRAG:
  case FL_RELEASE:
    o = which(Fl::event_x(), Fl::event_y());
    if (event == FL_RELEASE) {
      push(0);
      if (o && Fl::visible_focus() && Fl::focus()!=this) {
        Fl::focus(this);
        redraw_tabs();
      }
      if (o &&                              // Released on a tab and..
          (value(o) ||                      // tab changed value or..
	   (when()&(FL_WHEN_NOT_CHANGED))   // ..no change but WHEN_NOT_CHANGED set,
	  )                                 // handles FL_WHEN_RELEASE_ALWAYS too.
	 ) {
        Fl_Widget_Tracker wp(o);
        set_changed();
	do_callback();
	if (wp.deleted()) return 1;
      }
      Fl_Tooltip::current(o);
    } else {
      push(o);
    }
    return 1;
  case FL_MOVE: {
    int ret = Fl_Group::handle(event);
    Fl_Widget *o = Fl_Tooltip::current(), *n = o;
    int H = tab_height();
    if ( (H>=0) && (Fl::event_y()>y()+H) )
      return ret;
    else if ( (H<0) && (Fl::event_y() < y()+h()+H) )
      return ret;
    else {
      n = which(Fl::event_x(), Fl::event_y());
      if (!n) n = this;
    }
    if (n!=o)
      Fl_Tooltip::enter(n);
    return ret; }
  case FL_FOCUS:
  case FL_UNFOCUS:
    if (!Fl::visible_focus()) return Fl_Group::handle(event);
    if (Fl::event() == FL_RELEASE ||
	Fl::event() == FL_SHORTCUT ||
	Fl::event() == FL_KEYBOARD ||
	Fl::event() == FL_FOCUS ||
	Fl::event() == FL_UNFOCUS) {
      redraw_tabs();
      if (Fl::event() == FL_FOCUS) return Fl_Group::handle(event);
      if (Fl::event() == FL_UNFOCUS) return 0;
      else return 1;
    } else return Fl_Group::handle(event);
  case FL_KEYBOARD:
    switch (Fl::event_key()) {
      case FL_Left:
	if (!children()) return 0;
	if (child(0)->visible()) return 0;
	for (i = 1; i < children(); i ++)
	  if (child(i)->visible()) break;
	value(child(i - 1));
	set_changed();
	do_callback();
        return 1;
      case FL_Right:
	if (!children()) return 0;
	if (child(children() - 1)->visible()) return 0;
	for (i = 0; i < children(); i ++)
	  if (child(i)->visible()) break;
	value(child(i + 1));
	set_changed();
	do_callback();
        return 1;
      case FL_Down:
        redraw();
        return Fl_Group::handle(FL_FOCUS);
      default:
        break;
    }
    return Fl_Group::handle(event);
  case FL_SHORTCUT:
    for (i = 0; i < children(); ++i) {
      Fl_Widget *c = child(i);
      if (c->test_shortcut(c->label())) {
        char sc = !c->visible();
        value(c);
        if (sc) set_changed();
        do_callback();
        return 1;
      }
    }
    return Fl_Group::handle(event);
  case FL_SHOW:
    value(); // update visibilities and fall through
  default:
    return Fl_Group::handle(event);

  }
}